

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteAction(BinaryWriterSpec *this,Action *action)

{
  ActionType AVar1;
  char *pcVar2;
  string_view s;
  
  Stream::Writef(this->json_stream_,"\"%s\": ","action");
  Stream::Writef(this->json_stream_,"{");
  Stream::Writef(this->json_stream_,"\"%s\": ","type");
  if (action->type_ == Invoke) {
    pcVar2 = "invoke";
  }
  else {
    if (action->type_ != Get) {
      __assert_fail("action.type() == ActionType::Get",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-writer-spec.cc"
                    ,0x151,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteAction(const Action &)"
                   );
    }
    pcVar2 = "get";
  }
  Stream::Writef(this->json_stream_,"\"%s\"",pcVar2);
  Stream::Writef(this->json_stream_,", ");
  if ((action->module_var).type_ == Name) {
    Stream::Writef(this->json_stream_,"\"%s\": ","module");
    WriteVar(this,&action->module_var);
    Stream::Writef(this->json_stream_,", ");
  }
  AVar1 = action->type_;
  Stream::Writef(this->json_stream_,"\"%s\": ","field");
  s._M_str = (action->name)._M_dataplus._M_p;
  s._M_len = (action->name)._M_string_length;
  WriteEscapedString(this,s);
  if (AVar1 == Invoke) {
    Stream::Writef(this->json_stream_,", ");
    Stream::Writef(this->json_stream_,"\"%s\": ","args");
    if (action->type_ != Invoke) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                    ,0x48,
                    "const Derived *wabt::cast(const Base *) [Derived = wabt::InvokeAction, Base = wabt::Action]"
                   );
    }
    WriteConstVector(this,(ConstVector *)(action + 1));
  }
  Stream::Writef(this->json_stream_,"}");
  return;
}

Assistant:

void BinaryWriterSpec::WriteAction(const Action& action) {
  WriteKey("action");
  json_stream_->Writef("{");
  WriteKey("type");
  if (action.type() == ActionType::Invoke) {
    WriteString("invoke");
  } else {
    assert(action.type() == ActionType::Get);
    WriteString("get");
  }
  WriteSeparator();
  if (action.module_var.is_name()) {
    WriteKey("module");
    WriteVar(action.module_var);
    WriteSeparator();
  }
  if (action.type() == ActionType::Invoke) {
    WriteKey("field");
    WriteEscapedString(action.name);
    WriteSeparator();
    WriteKey("args");
    WriteConstVector(cast<InvokeAction>(&action)->args);
  } else {
    WriteKey("field");
    WriteEscapedString(action.name);
  }
  json_stream_->Writef("}");
}